

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::abortAfterX(ConfigData *config,int x)

{
  runtime_error *this;
  int in_ESI;
  long in_RDI;
  
  if (in_ESI < 1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Value after -x or --abortAfter must be greater than zero");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(int *)(in_RDI + 0xc) = in_ESI;
  return;
}

Assistant:

inline void abortAfterX( ConfigData& config, int x ) {
        if( x < 1 )
            throw std::runtime_error( "Value after -x or --abortAfter must be greater than zero" );
        config.abortAfter = x;
    }